

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarks.c
# Opt level: O0

void benchmark(Benchmarks *bench)

{
  bench_t bVar1;
  ulong uVar2;
  long in_RDI;
  bench_t time;
  
  bVar1 = now();
  uVar2 = bVar1 - *(long *)(in_RDI + 8);
  if (uVar2 < *(ulong *)(in_RDI + 0x10)) {
    *(ulong *)(in_RDI + 0x10) = uVar2;
  }
  if (*(ulong *)(in_RDI + 0x18) < uVar2) {
    *(ulong *)(in_RDI + 0x18) = uVar2;
  }
  *(ulong *)(in_RDI + 0x20) = uVar2 + *(long *)(in_RDI + 0x20);
  *(ulong *)(in_RDI + 0x28) = uVar2 * uVar2 + *(long *)(in_RDI + 0x28);
  return;
}

Assistant:

void benchmark(Benchmarks* bench) {
	const bench_t time = now() - bench->single_start;

	if (time < bench->minimum) {
		bench->minimum = time;
	}

	if (time > bench->maximum) {
		bench->maximum = time;
	}

	bench->sum += time;
	bench->squared_sum += (time * time);
}